

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall cmUVJobServerClient::Impl::ReleaseToken(Impl *this)

{
  Impl *this_local;
  
  if (this->HeldTokens != 0) {
    this->HeldTokens = this->HeldTokens - 1;
    if (this->HeldTokens == 0) {
      ReleaseImplicitToken(this);
    }
    else {
      (*this->_vptr_Impl[2])();
    }
    return;
  }
  __assert_fail("this->HeldTokens > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                ,0x4e,"void cmUVJobServerClient::Impl::ReleaseToken()");
}

Assistant:

void cmUVJobServerClient::Impl::ReleaseToken()
{
  assert(this->HeldTokens > 0);
  --this->HeldTokens;
  if (this->HeldTokens == 0) {
    // This was the token implicitly owned by our process.
    this->ReleaseImplicitToken();
  } else {
    // This was a token we received from the job server.  Send it back.
    this->SendToken();
  }
}